

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_appender.cpp
# Opt level: O1

ArrowArray *
duckdb::ArrowAppender::FinalizeChild
          (LogicalType *type,
          unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
          *append_data_p)

{
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> _Var1;
  data_ptr_t pdVar2;
  _Head_base<0UL,_ArrowArray_*,_false> _Var3;
  _Head_base<0UL,_ArrowArray_*,_false> _Var4;
  type pAVar5;
  pointer pAVar6;
  long lVar7;
  reference pvVar8;
  pointer *__ptr;
  templated_unique_single_t result;
  _Head_base<0UL,_ArrowArray_*,_false> local_28;
  
  local_28._M_head_impl = (ArrowArray *)operator_new(0x50);
  (local_28._M_head_impl)->length = 0;
  (local_28._M_head_impl)->null_count = 0;
  (local_28._M_head_impl)->offset = 0;
  (local_28._M_head_impl)->n_buffers = 0;
  (local_28._M_head_impl)->n_children = 0;
  (local_28._M_head_impl)->buffers = (void **)0x0;
  (local_28._M_head_impl)->children = (ArrowArray **)0x0;
  (local_28._M_head_impl)->dictionary = (ArrowArray *)0x0;
  (local_28._M_head_impl)->release = (_func_void_ArrowArray_ptr *)0x0;
  (local_28._M_head_impl)->private_data = (void *)0x0;
  pAVar5 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator*(append_data_p);
  _Var1._M_head_impl =
       (append_data_p->
       super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
       .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
  (append_data_p->
  super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>.
  super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar6->private_data = _Var1._M_head_impl;
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar6->release = ReleaseArray;
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar6->n_children = 0;
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar6->null_count = 0;
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar6->offset = 0;
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar6->dictionary = (ArrowArray *)0x0;
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar6->buffers = (pAVar5->buffers)._M_elems;
  lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pAVar5->null_count);
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar6->null_count = lVar7;
  lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pAVar5->row_count);
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar6->length = lVar7;
  pvVar8 = vector<duckdb::ArrowBuffer,_true>::operator[](&pAVar5->arrow_buffers,0);
  pdVar2 = pvVar8->dataptr;
  pAVar6 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  *pAVar6->buffers = pdVar2;
  if (pAVar5->finalize != (finalize_t)0x0) {
    (*pAVar5->finalize)(pAVar5,type,local_28._M_head_impl);
  }
  _Var4._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (ArrowArray *)0x0;
  _Var3._M_head_impl =
       (pAVar5->array).super_unique_ptr<ArrowArray,_std::default_delete<ArrowArray>_>._M_t.
       super___uniq_ptr_impl<ArrowArray,_std::default_delete<ArrowArray>_>._M_t.
       super__Tuple_impl<0UL,_ArrowArray_*,_std::default_delete<ArrowArray>_>.
       super__Head_base<0UL,_ArrowArray_*,_false>._M_head_impl;
  (pAVar5->array).super_unique_ptr<ArrowArray,_std::default_delete<ArrowArray>_>._M_t.
  super___uniq_ptr_impl<ArrowArray,_std::default_delete<ArrowArray>_>._M_t.
  super__Tuple_impl<0UL,_ArrowArray_*,_std::default_delete<ArrowArray>_>.
  super__Head_base<0UL,_ArrowArray_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (ArrowArray *)0x0) {
    operator_delete(_Var3._M_head_impl);
  }
  _Var3._M_head_impl =
       (pAVar5->array).super_unique_ptr<ArrowArray,_std::default_delete<ArrowArray>_>._M_t.
       super___uniq_ptr_impl<ArrowArray,_std::default_delete<ArrowArray>_>._M_t.
       super__Tuple_impl<0UL,_ArrowArray_*,_std::default_delete<ArrowArray>_>.
       super__Head_base<0UL,_ArrowArray_*,_false>._M_head_impl;
  if (local_28._M_head_impl != (ArrowArray *)0x0) {
    operator_delete(local_28._M_head_impl);
  }
  return _Var3._M_head_impl;
}

Assistant:

ArrowArray *ArrowAppender::FinalizeChild(const LogicalType &type, unique_ptr<ArrowAppendData> append_data_p) {
	auto result = make_uniq<ArrowArray>();

	auto &append_data = *append_data_p;
	result->private_data = append_data_p.release();
	result->release = ReleaseArray;
	result->n_children = 0;
	result->null_count = 0;
	result->offset = 0;
	result->dictionary = nullptr;
	result->buffers = append_data.buffers.data();
	result->null_count = NumericCast<int64_t>(append_data.null_count);
	result->length = NumericCast<int64_t>(append_data.row_count);
	result->buffers[0] = append_data.GetValidityBuffer().data();

	if (append_data.finalize) {
		append_data.finalize(append_data, type, result.get());
	}

	append_data.array = std::move(result);
	return append_data.array.get();
}